

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::
sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::sparse_hashtable(sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *this,size_type expected_max_items_in_table,TransparentHasher *hf,
                  TransparentHasher *eql,Negation<int> *ext,SetKey<int,_Negation<int>_> *set,
                  Alloc<int,_unsigned_long,_18446744073709551615UL> *alloc)

{
  int iVar1;
  size_type sz;
  ulong uVar2;
  float fVar3;
  float fVar4;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_28;
  
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher.num_compares_ = (hf->super_Hasher).num_compares_;
  iVar1 = (hf->super_Hasher).num_hashes_;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher.id_ = (hf->super_Hasher).id_;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher.num_hashes_ = iVar1;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.use_empty_
       = false;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  use_deleted_ = false;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_threshold_ = 0;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_threshold_ = 0;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_factor_ = 0.8;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_factor_ = 0.32;
  iVar1 = (eql->super_Hasher).num_hashes_;
  (this->key_info).super_TransparentHasher.super_Hasher.id_ = (eql->super_Hasher).id_;
  (this->key_info).super_TransparentHasher.super_Hasher.num_hashes_ = iVar1;
  (this->key_info).super_TransparentHasher.super_Hasher.num_compares_ =
       (eql->super_Hasher).num_compares_;
  this->num_deleted = 0;
  if (expected_max_items_in_table == 0) {
    sz = 0x20;
  }
  else {
    sz = sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
         min_buckets((sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *)this,
                     expected_max_items_in_table,0);
  }
  local_28.id_ = alloc->id_;
  local_28._4_4_ = *(undefined4 *)&alloc->field_0x4;
  local_28.count_ = alloc->count_;
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  sparsetable(&this->table,sz,&local_28);
  fVar3 = (float)(this->table).settings.table_size;
  fVar4 = (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          enlarge_factor_ * fVar3;
  uVar2 = (ulong)fVar4;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar4 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
  fVar3 = fVar3 * (this->settings).
                  super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                  shrink_factor_;
  uVar2 = (ulong)fVar3;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar3 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  return;
}

Assistant:

explicit sparse_hashtable(size_type expected_max_items_in_table = 0,
                            const HashFcn& hf = HashFcn(),
                            const EqualKey& eql = EqualKey(),
                            const ExtractKey& ext = ExtractKey(),
                            const SetKey& set = SetKey(),
                            const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        table((expected_max_items_in_table == 0
                   ? HT_DEFAULT_STARTING_BUCKETS
                   : settings.min_buckets(expected_max_items_in_table, 0)),
              alloc) {
    settings.reset_thresholds(bucket_count());
  }